

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O3

uint __thiscall leveldb::log::Reader::ReadPhysicalRecord(Reader *this,Slice *result)

{
  char cVar1;
  ushort uVar2;
  int iVar3;
  int *piVar4;
  Reporter *pRVar5;
  uint32_t uVar6;
  uint64_t uVar7;
  char *reason;
  ulong uVar8;
  ulong uVar9;
  Status status;
  void *local_40;
  Slice *local_38;
  
  uVar8 = (this->buffer_).size_;
  if (uVar8 < 7) {
    do {
      (this->buffer_).data_ = "";
      (this->buffer_).size_ = 0;
      if (this->eof_ != false) {
        return 5;
      }
      (*this->file_->_vptr_SequentialFile[2])
                (&local_40,this->file_,0x8000,&this->buffer_,this->backing_store_);
      uVar8 = (this->buffer_).size_;
      uVar7 = this->end_of_buffer_offset_ + uVar8;
      this->end_of_buffer_offset_ = uVar7;
      if (local_40 != (void *)0x0) {
        (this->buffer_).data_ = "";
        (this->buffer_).size_ = 0;
        pRVar5 = this->reporter_;
        if ((pRVar5 == (Reporter *)0x0) || (uVar7 - 0x8000 < this->initial_offset_)) {
          this->eof_ = true;
        }
        else {
          (*pRVar5->_vptr_Reporter[2])(pRVar5,0x8000,&local_40);
          this->eof_ = true;
          if (local_40 == (void *)0x0) {
            return 5;
          }
        }
        operator_delete__(local_40);
        return 5;
      }
      if (uVar8 < 0x8000) {
        this->eof_ = true;
      }
      uVar8 = (this->buffer_).size_;
    } while (uVar8 < 7);
  }
  piVar4 = (int *)(this->buffer_).data_;
  uVar2 = *(ushort *)(piVar4 + 1);
  uVar9 = (ulong)(uVar2 + 7);
  if (uVar8 < uVar9) {
    (this->buffer_).data_ = "";
    (this->buffer_).size_ = 0;
    if (this->eof_ != false) {
      return 5;
    }
    reason = "bad record length";
LAB_00114a53:
    ReportCorruption(this,uVar8,reason);
  }
  else {
    cVar1 = *(char *)((long)piVar4 + 6);
    if ((cVar1 == '\0') && (uVar2 == 0)) {
      (this->buffer_).data_ = "";
      (this->buffer_).size_ = 0;
      return 6;
    }
    if (this->checksum_ == true) {
      iVar3 = *piVar4;
      local_38 = result;
      uVar6 = crc32c::Extend(0,(char *)((long)piVar4 + 6),(ulong)(uVar2 + 1));
      uVar8 = (this->buffer_).size_;
      result = local_38;
      if (uVar6 != ((iVar3 + 0x5d7d1528U) * 0x8000 | iVar3 + 0x5d7d1528U >> 0x11)) {
        (this->buffer_).data_ = "";
        (this->buffer_).size_ = 0;
        reason = "checksum mismatch";
        goto LAB_00114a53;
      }
    }
    if (uVar8 < uVar9) {
      __assert_fail("n <= size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/include/leveldb/slice.h"
                    ,0x46,"void leveldb::Slice::remove_prefix(size_t)");
    }
    (this->buffer_).data_ = (this->buffer_).data_ + uVar9;
    (this->buffer_).size_ = uVar8 - uVar9;
    if (this->initial_offset_ <=
        (this->end_of_buffer_offset_ - ((uVar8 - uVar9) + (ulong)uVar2)) - 7) {
      result->data_ = (char *)((long)piVar4 + 7);
      result->size_ = (ulong)uVar2;
      return (int)cVar1;
    }
    result->data_ = "";
    result->size_ = 0;
  }
  return 6;
}

Assistant:

unsigned int Reader::ReadPhysicalRecord(Slice* result) {
  while (true) {
    if (buffer_.size() < kHeaderSize) {
      if (!eof_) {
        // Last read was a full read, so this is a trailer to skip
        buffer_.clear();
        Status status = file_->Read(kBlockSize, &buffer_, backing_store_);
        end_of_buffer_offset_ += buffer_.size();
        if (!status.ok()) {
          buffer_.clear();
          ReportDrop(kBlockSize, status);
          eof_ = true;
          return kEof;
        } else if (buffer_.size() < kBlockSize) {
          eof_ = true;
        }
        continue;
      } else {
        // Note that if buffer_ is non-empty, we have a truncated header at the
        // end of the file, which can be caused by the writer crashing in the
        // middle of writing the header. Instead of considering this an error,
        // just report EOF.
        buffer_.clear();
        return kEof;
      }
    }

    // Parse the header
    const char* header = buffer_.data();
    const uint32_t a = static_cast<uint32_t>(header[4]) & 0xff;
    const uint32_t b = static_cast<uint32_t>(header[5]) & 0xff;
    const unsigned int type = header[6];
    const uint32_t length = a | (b << 8);
    if (kHeaderSize + length > buffer_.size()) {
      size_t drop_size = buffer_.size();
      buffer_.clear();
      if (!eof_) {
        ReportCorruption(drop_size, "bad record length");
        return kBadRecord;
      }
      // If the end of the file has been reached without reading |length| bytes
      // of payload, assume the writer died in the middle of writing the record.
      // Don't report a corruption.
      return kEof;
    }

    if (type == kZeroType && length == 0) {
      // Skip zero length record without reporting any drops since
      // such records are produced by the mmap based writing code in
      // env_posix.cc that preallocates file regions.
      buffer_.clear();
      return kBadRecord;
    }

    // Check crc
    if (checksum_) {
      uint32_t expected_crc = crc32c::Unmask(DecodeFixed32(header));
      uint32_t actual_crc = crc32c::Value(header + 6, 1 + length);
      if (actual_crc != expected_crc) {
        // Drop the rest of the buffer since "length" itself may have
        // been corrupted and if we trust it, we could find some
        // fragment of a real log record that just happens to look
        // like a valid log record.
        size_t drop_size = buffer_.size();
        buffer_.clear();
        ReportCorruption(drop_size, "checksum mismatch");
        return kBadRecord;
      }
    }

    buffer_.remove_prefix(kHeaderSize + length);

    // Skip physical record that started before initial_offset_
    if (end_of_buffer_offset_ - buffer_.size() - kHeaderSize - length <
        initial_offset_) {
      result->clear();
      return kBadRecord;
    }

    *result = Slice(header + kHeaderSize, length);
    return type;
  }
}